

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1cb45::BuildEngineTest_StatusCallbacks_Test::TestBody
          (BuildEngineTest_StatusCallbacks_Test *this)

{
  pointer puVar1;
  SimpleRule *pSVar2;
  ValueType *pVVar3;
  char *pcVar4;
  uint numComplete;
  uint numScanned;
  BuildEngine engine;
  SimpleBuildEngineDelegate delegate;
  uint local_1c0 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_190;
  _Alloc_hider local_188;
  undefined1 local_178 [16];
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_168;
  CommandSignature local_150;
  _Any_data local_148;
  code *local_138;
  undefined8 uStack_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  BuildEngineDelegate local_80;
  ExecutionQueueDelegate local_78;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  local_1c0[1] = 0;
  local_1c0[0] = 0;
  local_80._vptr_BuildEngineDelegate = (_func_int **)&PTR__SimpleBuildEngineDelegate_001fd6c8;
  local_78.super_ProcessDelegate._vptr_ProcessDelegate =
       (ProcessDelegate)&PTR__ZThn8_N12_GLOBAL__N_125SimpleBuildEngineDelegateD1Ev_001fd748;
  local_70._0_8_ = (pointer)0x0;
  local_70[8] = 0;
  local_70._9_7_ = 0;
  local_70[0x10] = 0;
  local_70._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  llbuild::core::BuildEngine::BuildEngine((BuildEngine *)(local_178 + 8),&local_80);
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"input","");
  local_188._M_p = (pointer)0x0;
  local_198 = (undefined1  [8])0x0;
  pbStack_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:729:20)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:729:20)>
             ::_M_manager;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_88 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:732:7)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:732:7)>
             ::_M_manager;
  local_178._0_8_ = 0;
  local_a0._M_unused._M_object = local_1c0 + 1;
  local_a0._8_8_ = local_1c0;
  SimpleRule::SimpleRule
            (pSVar2,(KeyType *)&local_1b8,
             (vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *)local_198,
             (ComputeFnType *)&local_e8,(ValidFnType *)&local_108,(StatusFnType *)&local_a0,
             (CommandSignature *)local_178);
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)pSVar2;
  llbuild::core::BuildEngine::addRule
            ((BuildEngine *)(local_178 + 8),
             (unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
             &local_168);
  if ((SimpleRule *)
      local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
      _M_impl.super__Vector_impl_data._M_start != (SimpleRule *)0x0) {
    (*((Rule *)&(local_168.
                 super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                 ._M_impl.super__Vector_impl_data._M_start)->key)->_vptr_Rule[1])();
  }
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector
            ((vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *)local_198);
  if (local_1b8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8) {
    operator_delete(local_1b8._M_head_impl,local_1a8[0] + 1);
  }
  pSVar2 = (SimpleRule *)operator_new(0xa8);
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"output","");
  local_198 = (undefined1  [8])&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"input","");
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<llbuild::core::KeyType,std::allocator<llbuild::core::KeyType>>::
  _M_range_initialize<llbuild::core::KeyType_const*>
            ((vector<llbuild::core::KeyType,std::allocator<llbuild::core::KeyType>> *)&local_168,
             (string *)local_198,local_178);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:742:20)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:742:20)>
              ::_M_manager;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_138 = (code *)0x0;
  uStack_130 = 0;
  local_c0._M_unused._M_object = local_1c0 + 1;
  local_c0._8_8_ = local_1c0;
  local_a8 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:746:7)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<void_(llbuild::core::Rule::StatusKind),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:746:7)>
             ::_M_manager;
  local_150.value = 0;
  SimpleRule::SimpleRule
            (pSVar2,(KeyType *)&local_1b8,&local_168,(ComputeFnType *)&local_128,
             (ValidFnType *)&local_148,(StatusFnType *)&local_c0,&local_150);
  local_178._0_8_ = pSVar2;
  llbuild::core::BuildEngine::addRule
            ((BuildEngine *)(local_178 + 8),
             (unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)local_178
            );
  if ((SimpleRule *)local_178._0_8_ != (SimpleRule *)0x0) {
    (**(code **)(*(long *)local_178._0_8_ + 8))();
  }
  local_178._0_8_ = 0;
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_168);
  if (local_198 != (undefined1  [8])&local_188) {
    operator_delete((void *)local_198,(ulong)(local_188._M_p + 1));
  }
  if (local_1b8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8) {
    operator_delete(local_1b8._M_head_impl,local_1a8[0] + 1);
  }
  local_168.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_168.
                         super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  local_1b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"output","");
  pVVar3 = llbuild::core::BuildEngine::build((BuildEngine *)(local_178 + 8),(KeyType *)&local_1b8);
  puVar1 = (pVVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(pVVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 4) {
    local_178._0_4_ = *(undefined4 *)puVar1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_198,"2 * 3","intFromValue(engine.build(\"output\"))",
               (int *)&local_168,(int *)local_178);
    if (local_1b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8) {
      operator_delete(local_1b8._M_head_impl,local_1a8[0] + 1);
    }
    if (local_198[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_1b8);
      if (pbStack_190 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (pbStack_190->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
                 ,0x2f4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
      if (local_1b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1b8._M_head_impl + 8))();
      }
    }
    if (pbStack_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_190,pbStack_190);
    }
    local_198._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_1b8,"2U","numScanned",(uint *)local_198,local_1c0 + 1);
    if (local_1b8._M_head_impl._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)local_198);
      if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_1b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
                 ,0x2f5,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
      if (local_198 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_198 + 8))();
      }
    }
    if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,local_1b0);
    }
    local_198._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&local_1b8,"2U","numComplete",(uint *)local_198,local_1c0);
    if (local_1b8._M_head_impl._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)local_198);
      if (local_1b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_1b0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
                 ,0x2f6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
      if (local_198 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_198 + 8))();
      }
    }
    if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,local_1b0);
    }
    llbuild::core::BuildEngine::~BuildEngine((BuildEngine *)(local_178 + 8));
    local_80._vptr_BuildEngineDelegate = (_func_int **)&PTR__SimpleBuildEngineDelegate_001fd6c8;
    local_78.super_ProcessDelegate._vptr_ProcessDelegate =
         (ProcessDelegate)&PTR__ZThn8_N12_GLOBAL__N_125SimpleBuildEngineDelegateD1Ev_001fd748;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70);
    (anonymous_namespace)::SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate(&local_78);
    llbuild::core::BuildEngineDelegate::~BuildEngineDelegate(&local_80);
    return;
  }
  __assert_fail("value.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
                ,0x55,"int32_t (anonymous namespace)::intFromValue(const core::ValueType &)");
}

Assistant:

TEST(BuildEngineTest, StatusCallbacks) {
  unsigned numScanned = 0;
  unsigned numComplete = 0;
  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "input", {}, [&] (const std::vector<int>& inputs) {
          return 2; },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "output", {"input"},
                   [&] (const std::vector<int>& inputs) {
                     return inputs[0] * 3;
                   },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));

  // Build the result.
  EXPECT_EQ(2 * 3, intFromValue(engine.build("output")));
  EXPECT_EQ(2U, numScanned);
  EXPECT_EQ(2U, numComplete);
}